

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

PIPELINE_RESOURCE_FLAGS __thiscall
Diligent::PipelineStateGLImpl::GetSamplerResourceFlag
          (PipelineStateGLImpl *this,TShaderStages *Stages,bool SilenceWarning)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  Char *Message;
  reference ppSVar4;
  undefined8 uVar5;
  char (*in_RCX) [16];
  char (*in_R8) [205];
  PIPELINE_RESOURCE_FLAGS local_a9;
  undefined1 local_98 [8];
  string _msg;
  PIPELINE_RESOURCE_FLAGS Flag;
  SHADER_SOURCE_LANGUAGE Lang;
  ShaderGLImpl **Stage;
  const_iterator __end1;
  const_iterator __begin1;
  TShaderStages *__range1;
  bool ConflictsFound;
  PIPELINE_RESOURCE_FLAGS SamplerResourceFlag;
  PIPELINE_RESOURCE_FLAGS UndefinedFlag;
  undefined1 local_40 [8];
  string msg;
  bool SilenceWarning_local;
  TShaderStages *Stages_local;
  PipelineStateGLImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = SilenceWarning;
  bVar2 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::empty
                    (Stages);
  if (bVar2) {
    FormatString<char[26],char[16]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!Stages.empty()",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSamplerResourceFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)local_40);
  }
  __range1._2_1_ = ~PIPELINE_RESOURCE_FLAG_NONE;
  bVar2 = false;
  __end1 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::begin
                     (Stages);
  Stage = (ShaderGLImpl **)
          std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::end
                    (Stages);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::ShaderGLImpl_*const_*,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
                                     *)&Stage), bVar3) {
    ppSVar4 = __gnu_cxx::
              __normal_iterator<Diligent::ShaderGLImpl_*const_*,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
              ::operator*(&__end1);
    _msg.field_2._12_4_ = ShaderGLImpl::GetSourceLanguage(*ppSVar4);
    local_a9 = PIPELINE_RESOURCE_FLAG_NONE;
    if (_msg.field_2._12_4_ != SHADER_SOURCE_LANGUAGE_HLSL) {
      local_a9 = PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;
    }
    _msg.field_2._M_local_buf[0xb] = local_a9;
    if (__range1._2_1_ == ~PIPELINE_RESOURCE_FLAG_NONE) {
      __range1._2_1_ = local_a9;
    }
    else if (__range1._2_1_ != local_a9) {
      bVar2 = true;
    }
    __gnu_cxx::
    __normal_iterator<Diligent::ShaderGLImpl_*const_*,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::operator++(&__end1);
  }
  if ((bVar2) && ((msg.field_2._M_local_buf[0xf] & 1U) == 0)) {
    FormatString<char[17],char_const*,char[205]>
              ((string *)local_98,(Diligent *)"Pipeline state \'",
               (char (*) [17])
               &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)
                        "\' uses shaders compiled from different source languages. When separable programs are not available, this may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures."
               ,in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  return __range1._2_1_;
}

Assistant:

PIPELINE_RESOURCE_FLAGS PipelineStateGLImpl::GetSamplerResourceFlag(const TShaderStages& Stages, bool SilenceWarning) const
{
    VERIFY_EXPR(!Stages.empty());

    constexpr auto UndefinedFlag = static_cast<PIPELINE_RESOURCE_FLAGS>(0xFF);

    auto SamplerResourceFlag = UndefinedFlag;
    bool ConflictsFound      = false;
    for (auto& Stage : Stages)
    {
        auto Lang = Stage->GetSourceLanguage();
        auto Flag = Lang == SHADER_SOURCE_LANGUAGE_HLSL ?
            PIPELINE_RESOURCE_FLAG_NONE :
            PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        if (SamplerResourceFlag == UndefinedFlag)
            SamplerResourceFlag = Flag;
        else if (SamplerResourceFlag != Flag)
            ConflictsFound = true;
    }

    if (ConflictsFound && !SilenceWarning)
    {
        LOG_WARNING_MESSAGE("Pipeline state '", m_Desc.Name,
                            "' uses shaders compiled from different source languages. When separable programs are not available, this "
                            "may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures.");
    }

    return SamplerResourceFlag;
}